

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mir-gen.c
# Opt level: O0

void process_insn_inputs_for_ssa_def_use_repr(gen_ctx_t gen_ctx,bb_insn_t_conflict bb_insn)

{
  MIR_insn_t insn_00;
  bb_insn_t_conflict def_00;
  int iVar1;
  undefined1 local_50 [8];
  insn_var_iterator_t iter;
  MIR_reg_t var;
  int op_num;
  bb_insn_t_conflict def;
  MIR_insn_t insn;
  bb_insn_t_conflict bb_insn_local;
  gen_ctx_t gen_ctx_local;
  
  insn_00 = bb_insn->insn;
  insn_var_iterator_init((insn_var_iterator_t *)local_50,insn_00);
  while( true ) {
    do {
      iVar1 = input_insn_var_iterator_next
                        (gen_ctx,(insn_var_iterator_t *)local_50,(MIR_reg_t *)&iter.op_part_num,
                         (int *)((long)&iter.op_part_num + 4));
      if (iVar1 == 0) {
        return;
      }
    } while ((uint)iter.op_part_num < 0x22);
    def_00 = (bb_insn_t_conflict)insn_00->ops[iter.op_part_num._4_4_].data;
    if (def_00 == (bb_insn_t_conflict)0x0) break;
    insn_00->ops[iter.op_part_num._4_4_].data = (void *)0x0;
    iVar1 = get_var_def_op_num(gen_ctx,(uint)iter.op_part_num,def_00->insn);
    add_ssa_edge(gen_ctx,def_00,iVar1,bb_insn,iter.op_part_num._4_4_);
  }
  __assert_fail("def != ((void*)0)",
                "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                ,0x9b2,"void process_insn_inputs_for_ssa_def_use_repr(gen_ctx_t, bb_insn_t)");
}

Assistant:

static void process_insn_inputs_for_ssa_def_use_repr (gen_ctx_t gen_ctx, bb_insn_t bb_insn) {
  MIR_insn_t insn = bb_insn->insn;
  bb_insn_t def;
  int op_num;
  MIR_reg_t var;
  insn_var_iterator_t iter;

  FOREACH_IN_INSN_VAR (gen_ctx, iter, insn, var, op_num) {
    if (var <= MAX_HARD_REG) continue;
    def = insn->ops[op_num].data;
    gen_assert (def != NULL);
    insn->ops[op_num].data = NULL;
    add_ssa_edge (gen_ctx, def, get_var_def_op_num (gen_ctx, var, def->insn), bb_insn, op_num);
  }
}